

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.h
# Opt level: O0

int32_t __thiscall icu_63::UCharsTrie::getValue(UCharsTrie *this)

{
  char16_t cVar1;
  char16_t *pos_00;
  int32_t local_20;
  int32_t leadUnit;
  char16_t *pos;
  UCharsTrie *this_local;
  
  pos_00 = this->pos_ + 1;
  cVar1 = *this->pos_;
  if ((cVar1 & 0x8000U) == 0) {
    local_20 = readNodeValue(pos_00,(uint)(ushort)cVar1);
  }
  else {
    local_20 = readValue(pos_00,(ushort)cVar1 & 0x7fff);
  }
  return local_20;
}

Assistant:

inline int32_t getValue() const {
        const char16_t *pos=pos_;
        int32_t leadUnit=*pos++;
        // U_ASSERT(leadUnit>=kMinValueLead);
        return leadUnit&kValueIsFinal ?
            readValue(pos, leadUnit&0x7fff) : readNodeValue(pos, leadUnit);
    }